

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_ict.cpp
# Opt level: O2

void __thiscall PrintICT::visit(PrintICT *this,Procedure *node)

{
  StmNode *pSVar1;
  Fragment *pFVar2;
  uint uVar3;
  
  printIR(this,"Procedure");
  uVar3 = this->level;
  this->level = uVar3 + 1;
  pSVar1 = node->body;
  if (pSVar1 != (StmNode *)0x0) {
    (*(pSVar1->super_ICTNode)._vptr_ICTNode[2])(pSVar1,this);
    uVar3 = this->level - 1;
  }
  this->level = uVar3;
  pFVar2 = (node->super_Fragment).next;
  if (pFVar2 != (Fragment *)0x0) {
    (*pFVar2->_vptr_Fragment[2])(pFVar2,this);
    return;
  }
  return;
}

Assistant:

void PrintICT::visit(Procedure *node) {
    printIR("Procedure");
    up_level();
    if (node->getBody()) {// printa os nos do body da procedure
        node->getBody()->accept(this);
    }
    down_level();
    if (node->getNext() != NULL) {
        node->getNext()->accept(this);
    }
}